

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_graph.cpp
# Opt level: O0

void handlegraph::algorithms::copy_path
               (PathHandleGraph *from,path_handle_t *from_path,MutablePathHandleGraph *into,
               path_handle_t *into_path)

{
  undefined8 uVar1;
  iterator *piVar2;
  bool bVar3;
  byte bVar4;
  undefined8 in_RCX;
  iterator *in_RDX;
  long *in_RDI;
  handle_t handle;
  iterator __end2;
  iterator __begin2;
  PathForEachSocket *__range2;
  iterator *in_stack_ffffffffffffff38;
  iterator *in_stack_ffffffffffffff40;
  iterator *this;
  PathForEachSocket *in_stack_ffffffffffffff60;
  undefined8 local_90;
  undefined8 local_88;
  char local_80 [9] [8];
  PathForEachSocket local_38;
  PathForEachSocket *local_28;
  undefined8 local_20;
  iterator *local_18;
  long *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_38 = PathHandleGraph::scan_path
                       ((PathHandleGraph *)in_stack_ffffffffffffff40,
                        (path_handle_t *)in_stack_ffffffffffffff38);
  local_28 = &local_38;
  PathForEachSocket::begin(in_stack_ffffffffffffff60);
  PathForEachSocket::end(in_stack_ffffffffffffff60);
  while( true ) {
    bVar3 = PathForEachSocket::iterator::operator!=
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (!bVar3) break;
    local_80[0] = (char  [8])PathForEachSocket::iterator::operator*(in_stack_ffffffffffffff38);
    piVar2 = local_18;
    uVar1 = local_20;
    in_stack_ffffffffffffff38 = *(iterator **)(*(long *)(local_18->step).data + -0xb0);
    in_stack_ffffffffffffff40 =
         (iterator *)((local_18->step).data + (long)(in_stack_ffffffffffffff38->step).data);
    this = local_18;
    local_90 = (**(code **)(*(long *)((long)local_8 + *(long *)(*local_8 + -0xb0)) + 0x20))
                         ((long)local_8 + *(long *)(*local_8 + -0xb0),local_80);
    bVar4 = (**(code **)(*(long *)((long)local_8 + *(long *)(*local_8 + -0xb0)) + 0x28))
                      ((long)local_8 + *(long *)(*local_8 + -0xb0),local_80);
    local_88 = (**(code **)(*(long *)((piVar2->step).data +
                                     (long)(in_stack_ffffffffffffff38->step).data) + 0x18))
                         (in_stack_ffffffffffffff40,&local_90,bVar4 & 1);
    (**(code **)(*(long *)(this->step).data + 0x168))(this,uVar1,&local_88);
    PathForEachSocket::iterator::operator++(this);
  }
  return;
}

Assistant:

void copy_path(const PathHandleGraph* from, const path_handle_t& from_path,
               MutablePathHandleGraph* into, const path_handle_t& into_path) {
    
    // copy steps
    for (handle_t handle : from->scan_path(from_path)) {
        into->append_step(into_path, into->get_handle(from->get_id(handle), from->get_is_reverse(handle)));
    }
}